

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrefixTools.cpp
# Opt level: O0

void printNodes(vector<TSNode,_std::allocator<TSNode>_> *nodes)

{
  TSNode self;
  TSNode self_00;
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  ostream *poVar4;
  TSTree *in_stack_ffffffffffffffa8;
  size_type local_18;
  size_type i;
  vector<TSNode,_std::allocator<TSNode>_> *nodes_local;
  
  std::operator<<((ostream *)&std::cerr,"Nodes at cursor: ");
  bVar1 = std::vector<TSNode,_std::allocator<TSNode>_>::empty(nodes);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"No nodes at cursor\n");
  }
  else {
    local_18 = std::vector<TSNode,_std::allocator<TSNode>_>::size(nodes);
    while (local_18 = local_18 - 1, local_18 != 0) {
      pvVar2 = std::vector<TSNode,_std::allocator<TSNode>_>::operator[](nodes,local_18);
      self.tree = in_stack_ffffffffffffffa8;
      self._0_24_ = *(undefined1 (*) [24])(pvVar2->context + 2);
      pcVar3 = ts_node_type(self);
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
      std::operator<<(poVar4," -> ");
    }
    pvVar2 = std::vector<TSNode,_std::allocator<TSNode>_>::operator[](nodes,0);
    self_00.tree = *(TSTree **)pvVar2->context;
    self_00._0_24_ = *(undefined1 (*) [24])(pvVar2->context + 2);
    pcVar3 = ts_node_type(self_00);
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
    std::operator<<(poVar4,"\n");
  }
  return;
}

Assistant:

void printNodes (vector<TSNode> &nodes) {
    std::cerr << "Nodes at cursor: ";

    if (nodes.empty()) {
        std::cerr << "No nodes at cursor\n";
        return;
    }

    for (auto i = nodes.size() - 1; i > 0; i--) {
        std::cerr << ts_node_type(nodes[i]) << " -> ";
    }

    std::cerr << ts_node_type(nodes[0]) << "\n";
}